

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O3

void __thiscall FParser::ErrorMessage(FParser *this,FString *msg)

{
  DFsScript *pDVar1;
  char *value;
  int stop;
  int iVar2;
  FString *this_00;
  undefined8 extraout_RAX;
  char *temp;
  char *pcVar3;
  int extraout_EDX;
  ulong uVar4;
  svalue_t *result;
  code *UNRECOVERED_JUMPTABLE;
  long lVar5;
  long lVar6;
  long *plVar7;
  FString FStack_48;
  int iStack_40;
  int iStack_3c;
  
  pDVar1 = this->Script;
  pcVar3 = pDVar1->data;
  uVar4 = 0;
  if (((pcVar3 <= this->Rover) && (this->Rover <= pcVar3 + pDVar1->len)) &&
     (pcVar3 < this->LineStart)) {
    uVar4 = 0;
    do {
      uVar4 = (ulong)((int)uVar4 + (uint)(*pcVar3 == '\n'));
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != this->LineStart);
  }
  iStack_40 = (int)msg->Chars;
  pcVar3 = "Script %d, line %d: %s";
  result = (svalue_t *)(ulong)(uint)pDVar1->scriptnum;
  FS_Error("Script %d, line %d: %s",result,uVar4);
  iStack_3c = extraout_EDX;
  if ((((FParser *)pcVar3)->TokenType[extraout_EDX] == operator_) &&
     (((FParser *)pcVar3)->TokenType[iStack_40] == operator_)) {
    PointlessBrackets((FParser *)pcVar3,&iStack_3c,&iStack_40);
  }
  stop = iStack_40;
  if (iStack_3c != iStack_40) {
    lVar5 = (long)num_operators;
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        value = *(char **)((long)&operators[0].string + lVar6);
        if (*(int *)((long)&operators[0].direction + lVar6) == 0) {
          iVar2 = FindOperatorBackwards((FParser *)pcVar3,iStack_3c,stop,value);
        }
        else {
          iVar2 = FindOperator((FParser *)pcVar3,iStack_3c,stop,value);
        }
        if (iVar2 != -1) {
          UNRECOVERED_JUMPTABLE = *(code **)((long)&operators[0].handler + lVar6);
          plVar7 = (long *)((long)((FParser *)pcVar3)->Tokens +
                           *(long *)(&operators[0].field_0x10 + lVar6) + -0x10);
          if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
            UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar7 + -1);
          }
          (*UNRECOVERED_JUMPTABLE)(plVar7,result,iStack_3c,iVar2,stop,UNRECOVERED_JUMPTABLE);
          return;
        }
        lVar6 = lVar6 + 0x20;
      } while (lVar5 * 0x20 != lVar6);
    }
    if (((FParser *)pcVar3)->TokenType[iStack_3c] != function) {
      FStack_48.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      if (iStack_3c <= stop) {
        lVar5 = 0;
        do {
          this_00 = FString::operator+=(&FStack_48,((FParser *)pcVar3)->Tokens[iStack_3c + lVar5]);
          FString::operator+=(this_00,' ');
          lVar5 = lVar5 + 1;
        } while ((stop - iStack_3c) + 1 != (int)lVar5);
      }
      script_error("couldnt evaluate expression: %s\n",FStack_48.Chars);
      FString::~FString(&FStack_48);
      _Unwind_Resume(extraout_RAX);
    }
    EvaluateFunction((FParser *)pcVar3,result,iStack_3c,stop);
    return;
  }
  SimpleEvaluate((FParser *)pcVar3,result,iStack_40);
  return;
}

Assistant:

void FParser::ErrorMessage(FString msg)
{
	int linenum = 0;

	// find the line number
	if(Rover >= Script->data && Rover <= Script->data+Script->len)
    {
		char *temp;
		for(temp = Script->data; temp<LineStart; temp++)
			if(*temp == '\n') linenum++;    // count EOLs
    }

	//lineinfo.Format("Script %d, line %d: ", Script->scriptnum, linenum);
	FS_Error("Script %d, line %d: %s", Script->scriptnum, linenum, msg.GetChars());
}